

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_optimize(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,bool *interrupt)

{
  bool bVar1;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Real RVar2;
  bool *in_stack_00000170;
  bool in_stack_0000017f;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000180;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffff78;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff80;
  undefined1 local_70 [96];
  undefined1 *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::invalidate(&in_RDI->_solReal);
  in_RDI->_optimizeCalls = in_RDI->_optimizeCalls + 1;
  (*in_RDI->_statistics->solvingTime->_vptr_Timer[3])();
  bVar1 = boolParam(in_RDI,PERSISTENTSCALING);
  if (bVar1) {
    if (((in_RDI->_scaler ==
          (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) ||
        (bVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::isScaled(in_RDI->_realLP), bVar1)) ||
       (bVar1 = _reapplyPersistentScaling(in_RDI), !bVar1)) {
      if ((in_RDI->_scaler ==
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0) &&
         (bVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isScaled(in_RDI->_realLP), bVar1)) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::unscaleLPandReloadBasis(in_stack_ffffffffffffff80);
        in_RDI->_isRealLPScaled = false;
        in_RDI->_unscaleCalls = in_RDI->_unscaleCalls + 1;
      }
    }
    else {
      (*in_RDI->_scaler->_vptr_SPxScaler[0xd])(in_RDI->_scaler,in_RDI->_realLP,1);
      bVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isScaled(in_RDI->_realLP);
      in_RDI->_isRealLPScaled = bVar1;
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::invalidateBasis(in_stack_ffffffffffffff80);
    }
  }
  in_RDI->_lastSolveMode = 0;
  if ((in_RDI->_hasBasis & 1U) == 0) {
    in_stack_ffffffffffffff80 =
         (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)realParam(in_RDI,OBJLIMIT_LOWER);
    RVar2 = realParam(in_RDI,INFTY);
    if (((double)in_stack_ffffffffffffff80 == -RVar2) &&
       (!NAN((double)in_stack_ffffffffffffff80) && !NAN(-RVar2))) {
      in_stack_ffffffffffffff78 = (cpp_dec_float<100U,_int,_void> *)realParam(in_RDI,OBJLIMIT_UPPER)
      ;
      RVar2 = realParam(in_RDI,INFTY);
      if (((double)in_stack_ffffffffffffff78 == RVar2) &&
         (!NAN((double)in_stack_ffffffffffffff78) && !NAN(RVar2))) {
        _preprocessAndSolveReal(in_stack_00000180,in_stack_0000017f,in_stack_00000170);
        goto LAB_0060f327;
      }
    }
  }
  _preprocessAndSolveReal(in_stack_00000180,in_stack_0000017f,in_stack_00000170);
LAB_0060f327:
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::getBasisMetric((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_RDI,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  local_8 = &in_RDI->_statistics->finalBasisCondition;
  local_10 = local_70;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  (*in_RDI->_statistics->solvingTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SoPlexBase<R>::_optimize(volatile bool* interrupt)
{
   assert(_realLP != nullptr);
   assert(_realLP == &_solver);

   _solReal.invalidate();
   ++_optimizeCalls;

   // start timing
   _statistics->solvingTime->start();

   if(boolParam(SoPlexBase<R>::PERSISTENTSCALING))
   {
      // scale original problem; overwriting _realLP
      if(_scaler && !_realLP->isScaled() && _reapplyPersistentScaling())
      {
#ifdef SOPLEX_DEBUG
         SPxLPBase<R>* origLP = 0;
         spx_alloc(origLP);
         origLP = new(origLP) SPxLPBase<R>(*_realLP);
#endif
         _scaler->scale(*_realLP, true);
         _isRealLPScaled = _realLP->isScaled(); // a scaler might decide not to apply scaling
         _solver.invalidateBasis();
#ifdef SOPLEX_DEBUG
         _checkScaling(origLP);
#endif
      }
      // unscale previously scaled problem, overwriting _realLP
      else if(!_scaler && _realLP->isScaled())
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }
   }

   // remember that last solve was in floating-point
   _lastSolveMode = SOLVEMODE_REAL;

   // solve and store solution; if we have a starting basis, do not apply preprocessing; if we are solving from
   // scratch, apply preprocessing according to parameter settings
   if(!_hasBasis && realParam(SoPlexBase<R>::OBJLIMIT_LOWER) == -realParam(SoPlexBase<R>::INFTY)
         && realParam(SoPlexBase<R>::OBJLIMIT_UPPER) == realParam(SoPlexBase<R>::INFTY))
      _preprocessAndSolveReal(true, interrupt);
   else
      _preprocessAndSolveReal(false, interrupt);

   _statistics->finalBasisCondition = _solver.getBasisMetric(0);

   // stop timing
   _statistics->solvingTime->stop();
}